

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsScissorMultiViewportTests.cpp
# Opt level: O0

vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *
vkt::FragmentOperations::anon_unknown_0::generateScissors
          (vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
           *__return_storage_ptr__,int numScissors,IVec2 *renderSize)

{
  bool bVar1;
  float x_00;
  bool local_79;
  Vector<int,_4> local_64;
  bool local_51;
  int local_50;
  int iStack_4c;
  bool nextRow;
  int scissorNdx;
  int y;
  int x;
  undefined1 local_31;
  int local_30;
  int local_2c;
  int rectHeight;
  int rectWidth;
  int numRows;
  int numCols;
  IVec2 *renderSize_local;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *pvStack_10;
  int numScissors_local;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *scissors;
  
  _numRows = renderSize;
  renderSize_local._4_4_ = numScissors;
  pvStack_10 = __return_storage_ptr__;
  x_00 = deFloatSqrt((float)numScissors);
  rectWidth = deCeilFloatToInt32(x_00);
  rectHeight = deCeilFloatToInt32((float)renderSize_local._4_4_ / (float)rectWidth);
  local_2c = tcu::Vector<int,_2>::x(_numRows);
  local_2c = local_2c / rectWidth;
  local_30 = tcu::Vector<int,_2>::y(_numRows);
  local_30 = local_30 / rectHeight;
  local_31 = 0;
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            (__return_storage_ptr__);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::reserve
            (__return_storage_ptr__,(long)renderSize_local._4_4_);
  scissorNdx = 0;
  iStack_4c = 0;
  for (local_50 = 0; local_50 < renderSize_local._4_4_; local_50 = local_50 + 1) {
    bVar1 = local_50 % rectWidth == 0;
    local_79 = local_50 != 0 && bVar1;
    local_51 = local_79;
    if (local_50 != 0 && bVar1) {
      scissorNdx = 0;
      iStack_4c = local_30 + iStack_4c;
    }
    tcu::Vector<int,_4>::Vector(&local_64,scissorNdx,iStack_4c,local_2c,local_30);
    std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::push_back
              (__return_storage_ptr__,&local_64);
    scissorNdx = local_2c + scissorNdx;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<IVec4> generateScissors (const int numScissors, const IVec2& renderSize)
{
	// Scissor rects will be arranged in a grid-like fashion.

	const int numCols		= deCeilFloatToInt32(deFloatSqrt(static_cast<float>(numScissors)));
	const int numRows		= deCeilFloatToInt32(static_cast<float>(numScissors) / static_cast<float>(numCols));
	const int rectWidth		= renderSize.x() / numCols;
	const int rectHeight	= renderSize.y() / numRows;

	std::vector<IVec4> scissors;
	scissors.reserve(numScissors);

	int x = 0;
	int y = 0;

	for (int scissorNdx = 0; scissorNdx < numScissors; ++scissorNdx)
	{
		const bool nextRow = (scissorNdx != 0) && (scissorNdx % numCols == 0);
		if (nextRow)
		{
			x  = 0;
			y += rectHeight;
		}

		scissors.push_back(IVec4(x, y, rectWidth, rectHeight));

		x += rectWidth;
	}

	return scissors;
}